

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

uint __thiscall
wallet::CWallet::ComputeTimeSmart(CWallet *this,CWalletTx *wtx,bool rescanning_old_block)

{
  Chain *pCVar1;
  _Base_ptr p_Var2;
  CWalletTx *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2;
  char cVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  _Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> __tmp;
  long in_FS_OFFSET;
  int64_t block_max_time;
  int64_t blocktime;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ulong in_stack_ffffffffffffff00;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  string local_a8;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48;
  long local_38;
  
  puVar12 = &stack0xfffffffffffffef8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(__index_type *)
        ((long)&(wtx->m_state).
                super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        + 0x28) & 0xfd) == 0) {
    local_68 = *(undefined8 *)
                &(wtx->m_state).
                 super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 ._M_u;
    uStack_60 = *(undefined8 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 + 8);
    local_58 = *(undefined4 *)
                ((long)&(wtx->m_state).
                        super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                + 0x10);
    uStack_54 = *(undefined4 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 + 0x14);
    uStack_50 = *(undefined4 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 + 0x18);
    uStack_4c = *(undefined4 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 + 0x1c);
    local_48 = 1;
    pCVar1 = this->m_chain;
    if (pCVar1 == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    uVar8 = (ulong)wtx->nTimeReceived;
    uVar13 = 0;
    uVar14 = 0;
    uVar9 = 0;
    uVar10 = 0;
    puVar11 = &stack0xffffffffffffff00;
    cVar4 = (**(code **)(*(long *)pCVar1 + 0x50))(pCVar1,&local_68);
    if (cVar4 == '\0') {
      base_blob<256u>::ToString_abi_cxx11_
                (&local_88,
                 &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash);
      base_blob<256u>::ToString_abi_cxx11_(&local_a8,&local_68);
      parameters_1._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffefc;
      parameters_1._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffef8;
      parameters_1._M_string_length = in_stack_ffffffffffffff00;
      parameters_1.field_2._M_allocated_capacity = uVar9;
      parameters_1.field_2._8_8_ = uVar10;
      parameters_2._M_string_length = (size_type)puVar12;
      parameters_2._M_dataplus._M_p = puVar11;
      parameters_2.field_2._M_allocated_capacity = uVar13;
      parameters_2.field_2._8_8_ = uVar14;
      WalletLogPrintf<char_const*,std::__cxx11::string,std::__cxx11::string>
                (this,"%s: found %s in block %s not in index\n","ComputeTimeSmart",parameters_1,
                 parameters_2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else if (rescanning_old_block) {
      uVar8 = (ulong)in_stack_fffffffffffffef8;
    }
    else {
      uVar8 = (ulong)wtx->nTimeReceived;
      p_Var2 = (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var5 != p_Var2) {
        do {
          p_Var5 = (_Base_ptr)std::_Rb_tree_decrement(p_Var5);
          pCVar3 = (CWalletTx *)p_Var5[1]._M_parent;
          if (pCVar3 != wtx) {
            uVar7 = pCVar3->nTimeSmart;
            if (uVar7 == 0) {
              uVar7 = pCVar3->nTimeReceived;
            }
            uVar6 = (ulong)uVar7;
            if (uVar6 <= uVar8 + 300) {
              if (uVar8 <= uVar6) {
                uVar8 = uVar6;
              }
              goto LAB_0015d31d;
            }
          }
        } while (p_Var5 != p_Var2);
      }
      uVar6 = 0;
LAB_0015d31d:
      if ((long)uVar8 < (long)in_stack_ffffffffffffff00) {
        in_stack_ffffffffffffff00 = uVar8;
      }
      uVar8 = in_stack_ffffffffffffff00;
      if ((long)in_stack_ffffffffffffff00 < (long)uVar6) {
        uVar8 = uVar6;
      }
    }
  }
  else {
    uVar8 = (ulong)wtx->nTimeReceived;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uint)uVar8;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CWallet::ComputeTimeSmart(const CWalletTx& wtx, bool rescanning_old_block) const
{
    std::optional<uint256> block_hash;
    if (auto* conf = wtx.state<TxStateConfirmed>()) {
        block_hash = conf->confirmed_block_hash;
    } else if (auto* conf = wtx.state<TxStateBlockConflicted>()) {
        block_hash = conf->conflicting_block_hash;
    }

    unsigned int nTimeSmart = wtx.nTimeReceived;
    if (block_hash) {
        int64_t blocktime;
        int64_t block_max_time;
        if (chain().findBlock(*block_hash, FoundBlock().time(blocktime).maxTime(block_max_time))) {
            if (rescanning_old_block) {
                nTimeSmart = block_max_time;
            } else {
                int64_t latestNow = wtx.nTimeReceived;
                int64_t latestEntry = 0;

                // Tolerate times up to the last timestamp in the wallet not more than 5 minutes into the future
                int64_t latestTolerated = latestNow + 300;
                const TxItems& txOrdered = wtxOrdered;
                for (auto it = txOrdered.rbegin(); it != txOrdered.rend(); ++it) {
                    CWalletTx* const pwtx = it->second;
                    if (pwtx == &wtx) {
                        continue;
                    }
                    int64_t nSmartTime;
                    nSmartTime = pwtx->nTimeSmart;
                    if (!nSmartTime) {
                        nSmartTime = pwtx->nTimeReceived;
                    }
                    if (nSmartTime <= latestTolerated) {
                        latestEntry = nSmartTime;
                        if (nSmartTime > latestNow) {
                            latestNow = nSmartTime;
                        }
                        break;
                    }
                }

                nTimeSmart = std::max(latestEntry, std::min(blocktime, latestNow));
            }
        } else {
            WalletLogPrintf("%s: found %s in block %s not in index\n", __func__, wtx.GetHash().ToString(), block_hash->ToString());
        }
    }
    return nTimeSmart;
}